

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryContextTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetCurrentContextCase::executeForContext
          (GetCurrentContextCase *this,EGLDisplay display,EGLContext context,EGLSurface surface,
          Config *config)

{
  deUint32 err;
  MessageBuilder *pMVar1;
  Hex<16UL> local_4e8;
  Hex<16UL> local_4e0;
  MessageBuilder local_4d8;
  MessageBuilder local_358;
  MessageBuilder local_1c8;
  EGLContext local_48;
  EGLContext gotContext;
  TestLog *log;
  Library *egl;
  Config *config_local;
  EGLSurface surface_local;
  EGLContext context_local;
  EGLDisplay display_local;
  GetCurrentContextCase *this_local;
  
  egl = (Library *)config;
  config_local = (Config *)surface;
  surface_local = context;
  context_local = display;
  display_local = this;
  log = (TestLog *)
        EglTestContext::getLibrary
                  ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                   super_TestCase.m_eglTestCtx);
  gotContext = tcu::TestContext::getLog
                         ((this->super_SingleContextRenderCase).super_RenderCase.
                          super_SimpleConfigCase.super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
  eglu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
  local_48 = eglu::CallLogWrapper::eglGetCurrentContext(&this->super_CallLogWrapper);
  err = (*(code *)log->m_log[6].lock)();
  eglu::checkError(err,"eglGetCurrentContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQueryContextTests.cpp"
                   ,0x6b);
  if (local_48 == surface_local) {
    tcu::TestLog::operator<<
              (&local_1c8,(TestLog *)gotContext,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [7])"  Pass");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  }
  else if (local_48 == (EGLContext)0x0) {
    tcu::TestLog::operator<<
              (&local_358,(TestLog *)gotContext,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [27])"  Fail, got EGL_NO_CONTEXT")
    ;
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    tcu::TestContext::setTestResult
              ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Unexpected EGL_NO_CONTEXT");
  }
  else if (local_48 != surface_local) {
    tcu::TestLog::operator<<
              (&local_4d8,(TestLog *)gotContext,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_4d8,
                        (char (*) [52])"  Fail, call returned the wrong context. Expected: ");
    local_4e0 = tcu::toHex<void_*>(surface_local);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_4e0);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [8])0x29ae487);
    local_4e8 = tcu::toHex<void_*>(local_48);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_4e8);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4d8);
    tcu::TestContext::setTestResult
              ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid context");
  }
  eglu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
  return;
}

Assistant:

void executeForContext (EGLDisplay display, EGLContext context, EGLSurface surface, const Config& config)
	{
		const Library&	egl	= m_eglTestCtx.getLibrary();
		TestLog&		log	= m_testCtx.getLog();

		DE_UNREF(display);
		DE_UNREF(surface);
		DE_UNREF(config);

		enableLogging(true);

		const EGLContext	gotContext	= eglGetCurrentContext();
		EGLU_CHECK_MSG(egl, "eglGetCurrentContext");

		if (gotContext == context)
		{
			log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
		else if (gotContext == EGL_NO_CONTEXT)
		{
			log << TestLog::Message << "  Fail, got EGL_NO_CONTEXT" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected EGL_NO_CONTEXT");
		}
		else if (gotContext != context)
		{
			log << TestLog::Message << "  Fail, call returned the wrong context. Expected: " << tcu::toHex(context) << ", got: " << tcu::toHex(gotContext) << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid context");
		}

		enableLogging(false);
	}